

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

bool duckdb_yyjson::unsafe_yyjson_mut_equals(yyjson_mut_val *lhs,yyjson_mut_val *rhs)

{
  yyjson_mut_val *pyVar1;
  void *__s2;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  yyjson_mut_val *pyVar9;
  ulong uVar10;
  yyjson_mut_val *cur;
  ulong *puVar11;
  yyjson_val_uni *pyVar12;
  yyjson_val_uni *pyVar13;
  ulong uVar14;
  ulong *local_48;
  
  uVar7 = lhs->tag;
  bVar8 = (byte)uVar7 & 7;
  uVar14 = rhs->tag;
  bVar5 = (byte)uVar14 & 7;
  if (bVar8 != bVar5) {
    return false;
  }
  switch(bVar8) {
  case 0:
    break;
  default:
    if (uVar7 >> 8 == uVar14 >> 8) {
      iVar3 = bcmp((lhs->uni).ptr,(rhs->uni).ptr,uVar7 >> 8);
      return iVar3 == 0;
    }
    break;
  case 2:
  case 3:
    return uVar7 == uVar14;
  case 4:
    bVar8 = (byte)uVar7 & 0x18;
    bVar5 = (byte)uVar14 & 0x18;
    if (bVar8 == bVar5) {
      uVar4 = (lhs->uni).u64;
LAB_0124b123:
      return uVar4 == (rhs->uni).u64;
    }
    if (bVar8 == 8 && (uVar14 & 0x18) == 0) {
      uVar4 = (lhs->uni).i64;
      if (-1 < (long)uVar4) goto LAB_0124b123;
    }
    else if (((uVar7 & 0x18) == 0 && bVar5 == 8) && (-1 < (rhs->uni).i64)) {
      return (lhs->uni).u64 == (rhs->uni).i64;
    }
    break;
  case 6:
    uVar6 = uVar7 >> 8;
    if (uVar6 == uVar14 >> 8) {
      if (uVar7 < 0x100) {
        return true;
      }
      pyVar13 = &rhs->uni;
      pyVar12 = &lhs->uni;
      do {
        uVar6 = uVar6 - 1;
        pyVar1 = (yyjson_mut_val *)pyVar13->str;
        pyVar9 = (yyjson_mut_val *)pyVar12->str;
        bVar2 = unsafe_yyjson_mut_equals(pyVar9,pyVar1);
        if (!bVar2) {
          return bVar2;
        }
        pyVar12 = (yyjson_val_uni *)&pyVar9->next;
        pyVar13 = (yyjson_val_uni *)&pyVar1->next;
      } while (uVar6 != 0);
      return bVar2;
    }
    break;
  case 7:
    uVar10 = uVar7 >> 8;
    uVar6 = uVar14 >> 8;
    if (uVar10 != uVar6) {
      return false;
    }
    if (uVar7 < 0x100) {
      return true;
    }
    if (bVar5 == 7) {
      if (0xff < uVar14) {
        local_48 = (ulong *)(rhs->uni).u64;
        goto LAB_0124b154;
      }
    }
    else {
      uVar6 = 0;
    }
    local_48 = (ulong *)0x0;
LAB_0124b154:
    pyVar12 = &lhs->uni;
    do {
      pyVar1 = (yyjson_mut_val *)pyVar12->str;
      __s2 = (pyVar1->uni).ptr;
      if (__s2 == (void *)0x0 || uVar6 == 0) {
        pyVar9 = (yyjson_mut_val *)0x0;
      }
      else {
        uVar14 = pyVar1->tag >> 8;
        uVar7 = uVar6;
        puVar11 = local_48;
        do {
          puVar11 = *(ulong **)(puVar11[2] + 0x10);
          if ((*puVar11 >> 8 == uVar14) &&
             (iVar3 = bcmp((void *)puVar11[1],__s2,uVar14), iVar3 == 0)) {
            pyVar9 = (yyjson_mut_val *)puVar11[2];
            local_48 = puVar11;
            goto LAB_0124b1cb;
          }
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        pyVar9 = (yyjson_mut_val *)0x0;
      }
LAB_0124b1cb:
      if (pyVar9 == (yyjson_mut_val *)0x0) {
        return false;
      }
      pyVar1 = pyVar1->next;
      bVar2 = unsafe_yyjson_mut_equals(pyVar1,pyVar9);
      if (!bVar2) {
        return false;
      }
      uVar10 = uVar10 - 1;
      pyVar12 = (yyjson_val_uni *)&pyVar1->next;
      if (uVar10 == 0) {
        return true;
      }
    } while( true );
  }
  return false;
}

Assistant:

bool unsafe_yyjson_mut_equals(yyjson_mut_val *lhs, yyjson_mut_val *rhs) {
    yyjson_type type = unsafe_yyjson_get_type(lhs);
    if (type != unsafe_yyjson_get_type(rhs)) return false;

    switch (type) {
        case YYJSON_TYPE_OBJ: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                yyjson_mut_obj_iter iter;
                yyjson_mut_obj_iter_init(rhs, &iter);
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                while (len-- > 0) {
                    rhs = yyjson_mut_obj_iter_getn(&iter, lhs->uni.str,
                                                   unsafe_yyjson_get_len(lhs));
                    if (!rhs) return false;
                    if (!unsafe_yyjson_mut_equals(lhs->next, rhs)) return false;
                    lhs = lhs->next->next;
                }
            }
            /* yyjson allows duplicate keys, so the check may be inaccurate */
            return true;
        }

        case YYJSON_TYPE_ARR: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                rhs = (yyjson_mut_val *)rhs->uni.ptr;
                while (len-- > 0) {
                    if (!unsafe_yyjson_mut_equals(lhs, rhs)) return false;
                    lhs = lhs->next;
                    rhs = rhs->next;
                }
            }
            return true;
        }

        case YYJSON_TYPE_NUM:
            return unsafe_yyjson_num_equals(lhs, rhs);

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR:
            return unsafe_yyjson_str_equals(lhs, rhs);

        case YYJSON_TYPE_NULL:
        case YYJSON_TYPE_BOOL:
            return lhs->tag == rhs->tag;

        default:
            return false;
    }
}